

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-utils.h
# Opt level: O2

double tour_demand(Instance *instance,Tour *tour)

{
  uint uVar1;
  int32_t *piVar2;
  uint *puVar3;
  uint customer_idx;
  double local_20;
  
  piVar2 = tcomp(tour,0);
  if (*piVar2 < 0) {
    local_20 = 0.0;
  }
  else {
    local_20 = *instance->demands + 0.0;
    customer_idx = 0;
    while( true ) {
      puVar3 = (uint *)tsucc(tour,customer_idx);
      uVar1 = *puVar3;
      if ((ulong)uVar1 == 0) break;
      if ((int)uVar1 < 0) {
        __assert_fail("next_vertex >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                      ,0x98,"double tour_demand(const Instance *, Tour *)");
      }
      if (uVar1 == customer_idx) {
        __assert_fail("next_vertex != curr_vertex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                      ,0x99,"double tour_demand(const Instance *, Tour *)");
      }
      local_20 = local_20 + instance->demands[uVar1];
      customer_idx = uVar1;
    }
  }
  return local_20;
}

Assistant:

static inline double tour_demand(const Instance *instance, Tour *tour) {
    double demand = 0.0;
    if (*tcomp(tour, 0) >= 0) {
        int32_t curr_vertex = 0;
        int32_t next_vertex = -1;
        demand += instance->demands[0];

        while ((next_vertex = *tsucc(tour, curr_vertex)) != 0) {
            assert(next_vertex >= 0);
            assert(next_vertex != curr_vertex);
            demand += instance->demands[next_vertex];
            curr_vertex = next_vertex;
        }
    }
    return demand;
}